

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamRandomAccessController_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamRandomAccessController::SetErrorString
          (BamRandomAccessController *this,string *where,string *what)

{
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  string local_58 [8];
  char *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  string local_38 [56];
  
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::operator+(in_stack_ffffffffffffff98,__rhs);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x20),local_38);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void BamRandomAccessController::SetErrorString(const string& where, const string& what) {
    m_errorString = where + ": " + what;
}